

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O0

void XPMP2::RemoteAcRemove(Aircraft *ac)

{
  bool bVar1;
  XPMPPlaneID _id;
  unique_lock<std::mutex> *this;
  Aircraft *in_RDI;
  bool bDidLock;
  RemoteAcRemoveTy *in_stack_ffffffffffffffb8;
  unique_lock<std::mutex> *in_stack_ffffffffffffffc0;
  RemoteAcRemoveTy local_1c;
  unique_lock<std::mutex> *local_18;
  byte local_9;
  Aircraft *local_8;
  
  if (DAT_0047dd9c == 2) {
    local_9 = 0;
    local_8 = in_RDI;
    bVar1 = std::unique_lock::operator_cast_to_bool((unique_lock<std::mutex> *)0x360deb);
    if (!bVar1) {
      std::unique_lock<std::mutex>::lock(in_stack_ffffffffffffffc0);
      local_9 = 1;
    }
    this = (unique_lock<std::mutex> *)operator_new(0x10);
    _id = Aircraft::GetModeS_ID(local_8);
    RemoteAcRemoveTy::RemoteAcRemoveTy(&local_1c,_id);
    RmtDataEnqeueTy<XPMP2::RemoteAcRemoveTy,_(XPMP2::RemoteMsgTy)6>::RmtDataEnqeueTy
              ((RmtDataEnqeueTy<XPMP2::RemoteAcRemoveTy,_(XPMP2::RemoteMsgTy)6> *)this,
               in_stack_ffffffffffffffb8);
    local_18 = this;
    std::
    queue<std::unique_ptr<XPMP2::RmtDataBaseTy,std::default_delete<XPMP2::RmtDataBaseTy>>,std::__cxx11::list<std::unique_ptr<XPMP2::RmtDataBaseTy,std::default_delete<XPMP2::RmtDataBaseTy>>,std::allocator<std::unique_ptr<XPMP2::RmtDataBaseTy,std::default_delete<XPMP2::RmtDataBaseTy>>>>>
    ::emplace<XPMP2::RmtDataEnqeueTy<XPMP2::RemoteAcRemoveTy,(XPMP2::RemoteMsgTy)6>*>
              ((queue<std::unique_ptr<XPMP2::RmtDataBaseTy,_std::default_delete<XPMP2::RmtDataBaseTy>_>,_std::__cxx11::list<std::unique_ptr<XPMP2::RmtDataBaseTy,_std::default_delete<XPMP2::RmtDataBaseTy>_>,_std::allocator<std::unique_ptr<XPMP2::RmtDataBaseTy,_std::default_delete<XPMP2::RmtDataBaseTy>_>_>_>_>
                *)this,(RmtDataEnqeueTy<XPMP2::RemoteAcRemoveTy,_(XPMP2::RemoteMsgTy)6> **)
                       in_stack_ffffffffffffffb8);
    Aircraft::GetModeS_ID(local_8);
    std::
    map<unsigned_int,_XPMP2::RmtAcCacheTy,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
    ::erase((map<unsigned_int,_XPMP2::RmtAcCacheTy,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
             *)this,&in_stack_ffffffffffffffb8->modeS_id);
    if ((local_9 & 1) != 0) {
      std::unique_lock<std::mutex>::unlock(this);
    }
  }
  else {
    bVar1 = std::
            map<unsigned_int,_XPMP2::RmtAcCacheTy,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
            ::empty((map<unsigned_int,_XPMP2::RmtAcCacheTy,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
                     *)0x360dc5);
    if (!bVar1) {
      std::
      map<unsigned_int,_XPMP2::RmtAcCacheTy,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
      ::clear((map<unsigned_int,_XPMP2::RmtAcCacheTy,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
               *)0x360dd5);
    }
  }
  return;
}

Assistant:

void RemoteAcRemove (const Aircraft& ac)
{
    // Can only do anything reasonable if we are to send data
    if (glob.remoteStatus != REMOTE_SENDING) {
        if (!gmapRmtAcCache.empty())           // that's faster than searching for the individual plane...
            gmapRmtAcCache.clear();            // when we are not/no longer sending then the cache is outdated anyway
        return;
    }
    
    // We need the mutex to add to the queue
    bool bDidLock = false;                      // this isn't the most safe solution...but a recursive_mutex doesn't work with the condition variable used to notify the network thread
    if (!glockRmtData) {
        glockRmtData.lock();
        bDidLock = true;
    }
    
    // Add the plane id to the queue, marked for removal
    gqueueRmtData.emplace(new RmtDataAcRemoveTy(RemoteAcRemoveTy(ac.GetModeS_ID())));
    
    // Remove the plane from the cache
    gmapRmtAcCache.erase(ac.GetModeS_ID());
    
    // Undo the lock if we locked earlier
    if (bDidLock)
        glockRmtData.unlock();
}